

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluatePostModify(ExpressionEvalContext *ctx,ExprPostModify *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  SynBase *pSVar4;
  bool bVar5;
  int iVar6;
  StackFrame **ppSVar7;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  ExprBase *lhs;
  undefined4 extraout_var_00;
  ExprBase *pEVar9;
  
  if (((ctx->stackFrames).count != 0) &&
     (ppSVar7 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar7)->targetYield != 0)) {
    pAVar1 = ctx->ctx->allocator;
    iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = pSVar2;
    pEVar8->type = pTVar3;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223678;
    return pEVar8;
  }
  bVar5 = AddInstruction(ctx);
  if (((bVar5) && (pEVar8 = Evaluate(ctx,expression->value), pEVar8 != (ExprBase *)0x0)) &&
     (lhs = CreateLoad(ctx,pEVar8), lhs != (ExprBase *)0x0)) {
    pSVar2 = (expression->super_ExprBase).source;
    pAVar1 = ctx->ctx->allocator;
    iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
    pSVar4 = (expression->super_ExprBase).source;
    pTVar3 = lhs->type;
    pEVar9->typeID = 6;
    pEVar9->source = pSVar4;
    pEVar9->type = pTVar3;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
    pEVar9[1]._vptr_ExprBase = (_func_int **)0x1;
    pEVar9 = CreateBinaryOp(ctx,pSVar2,lhs,pEVar9,SYN_BINARY_OP_SUB - expression->isIncrement);
    if ((pEVar9 != (ExprBase *)0x0) && (bVar5 = CreateStore(ctx,pEVar8,pEVar9), bVar5)) {
      pEVar8 = CheckType(&expression->super_ExprBase,lhs);
      return pEVar8;
    }
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluatePostModify(ExpressionEvalContext &ctx, ExprPostModify *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *ptr = Evaluate(ctx, expression->value);

	if(!ptr)
		return NULL;

	ExprBase *value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	ExprBase *modified = CreateBinaryOp(ctx, expression->source, value, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, value->type, 1), expression->isIncrement ? SYN_BINARY_OP_ADD : SYN_BINARY_OP_SUB);

	if(!modified)
		return NULL;

	if(!CreateStore(ctx, ptr, modified))
		return NULL;

	return CheckType(expression, value);
}